

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ResetThreadId(Recycler *this)

{
  BOOL BVar1;
  PageAllocator *this_00;
  Recycler *this_local;
  
  HeapInfoManager::ResetThreadId(&this->autoHeap);
  BVar1 = IsConcurrentEnabled(this);
  if (BVar1 != 0) {
    this_00 = MarkContext::GetPageAllocator(&this->markContext);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ClearConcurrentThreadId(this_00);
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ClearConcurrentThreadId(&this->backgroundProfilerPageAllocator);
  return;
}

Assistant:

void
Recycler::ResetThreadId()
{
    autoHeap.ResetThreadId();
#if ENABLE_CONCURRENT_GC
    if (this->IsConcurrentEnabled())
    {
        markContext.GetPageAllocator()->ClearConcurrentThreadId();
    }
#endif
#if defined(DBG) && defined(PROFILE_EXEC)
    this->backgroundProfilerPageAllocator.ClearConcurrentThreadId();
#endif
}